

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

size_t fctkern__chk_cnt(fctkern_t *nk)

{
  size_t sVar1;
  fct_ts_t *ts_00;
  size_t sVar2;
  fct_ts_t *ts;
  size_t num_itemsts;
  size_t item_its;
  size_t tally;
  fctkern_t *nk_local;
  
  item_its = 0;
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x902
                  ,"size_t fctkern__chk_cnt(const fctkern_t *)");
  }
  if (nk != (fctkern_t *)0xfffffffffffffe28) {
    sVar1 = fct_nlist__size(&nk->ts_list);
    for (num_itemsts = 0; num_itemsts != sVar1; num_itemsts = num_itemsts + 1) {
      ts_00 = (fct_ts_t *)fct_nlist__at(&nk->ts_list,num_itemsts);
      sVar2 = fct_ts__chk_cnt(ts_00);
      item_its = sVar2 + item_its;
    }
  }
  return item_its;
}

Assistant:

static size_t
fctkern__chk_cnt(fctkern_t const *nk)
{
    size_t tally =0;
    FCT_ASSERT( nk != NULL );

    FCT_NLIST_FOREACH_BGN(fct_ts_t *, ts, &(nk->ts_list))
    {
        tally += fct_ts__chk_cnt(ts);
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}